

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sockfd.c
# Opt level: O3

void sfd_tran_pipe_fini(void *arg)

{
  nni_aio_fini((nni_aio *)((long)arg + 0x268));
  nni_aio_fini((nni_aio *)((long)arg + 0xa0));
  nni_aio_fini((nni_aio *)((long)arg + 0x430));
  nng_stream_free(*arg);
  nni_msg_free(*(nni_msg **)((long)arg + 0x5f8));
  nni_mtx_fini((nni_mtx *)((long)arg + 0x600));
  return;
}

Assistant:

static void
sfd_tran_pipe_fini(void *arg)
{
	sfd_tran_pipe *p = arg;

	nni_aio_fini(&p->rxaio);
	nni_aio_fini(&p->txaio);
	nni_aio_fini(&p->negoaio);
	nng_stream_free(p->conn);
	nni_msg_free(p->rxmsg);
	nni_mtx_fini(&p->mtx);
}